

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::format<long,ServiceFlags,ServiceFlags>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,long *args,ServiceFlags *args_1
          ,ServiceFlags *args_2)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream aoStack_208 [112];
  ios_base local_198 [264];
  FormatArg *local_90;
  undefined4 local_88;
  FormatArg local_80;
  long *local_68;
  code *local_60;
  code *local_58;
  ServiceFlags *local_50;
  code *local_48;
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(aoStack_208);
  local_90 = &local_80;
  local_88 = 3;
  local_80.m_formatImpl = detail::FormatArg::formatImpl<long>;
  local_80.m_toIntImpl = detail::FormatArg::toIntImpl<long>;
  local_60 = detail::FormatArg::formatImpl<ServiceFlags>;
  local_58 = detail::FormatArg::toIntImpl<ServiceFlags>;
  local_48 = detail::FormatArg::formatImpl<ServiceFlags>;
  local_40 = detail::FormatArg::toIntImpl<ServiceFlags>;
  local_80.m_value = fmt;
  local_68 = args;
  local_50 = args_1;
  detail::formatImpl((ostream *)aoStack_208,(char *)this,local_90,3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_208);
  std::ios_base::~ios_base(local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}